

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

void __thiscall QTest::WatchDog::run(WatchDog *this)

{
  Expectation e;
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CrashHandler::blockUnixSignals();
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  (this->expecting)._M_i = TestFunctionStart;
  std::condition_variable::notify_all();
  do {
    while( true ) {
      e = (this->expecting)._M_i;
      uVar2 = (ulong)((uint)e & 3);
      if (uVar2 - 1 < 2) break;
      if (uVar2 != 0) {
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          return;
        }
        __stack_chk_fail();
      }
    }
    bVar1 = waitFor(this,(unique_lock<std::mutex> *)local_28,e);
  } while (bVar1);
  fflush(_stderr);
  CrashHandler::printTestRunTime();
  CrashHandler::generateStackTrace();
  local_48[0] = '\x02';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_30 = "default";
  QMessageLogger::fatal(local_48,"Test function timed out");
}

Assistant:

void run() override
    {
        CrashHandler::blockUnixSignals();
        auto locker = qt_unique_lock(mutex);
        expecting.store(TestFunctionStart, std::memory_order_release);
        waitCondition.notify_all();
        while (true) {
            Expectation e = expecting.load(std::memory_order_acquire);
            switch (state(e)) {
            case ThreadEnd:
                return;
            case ThreadStart:
                Q_UNREACHABLE();
            case TestFunctionStart:
            case TestFunctionEnd:
                if (Q_UNLIKELY(!waitFor(locker, e))) {
                    std::fflush(stderr);
                    CrashHandler::printTestRunTime();
                    CrashHandler::generateStackTrace();
                    qFatal("Test function timed out");
                }
            }
        }
    }